

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::XThreadFulfiller<void>::reject(XThreadFulfiller<void> *this,Exception *exception)

{
  bool bVar1;
  XThreadPafImpl<void> *pXVar2;
  Exception *exception_00;
  FulfillScope local_20;
  FulfillScope scope;
  Exception *exception_local;
  XThreadFulfiller<void> *this_local;
  
  scope.obj = (XThreadPaf *)exception;
  XThreadPaf::FulfillScope::FulfillScope(&local_20,&this->target);
  bVar1 = XThreadPaf::FulfillScope::shouldFulfill(&local_20);
  if (bVar1) {
    pXVar2 = XThreadPaf::FulfillScope::getTarget<void>(&local_20);
    exception_00 = mv<kj::Exception>((Exception *)scope.obj);
    ExceptionOrValue::addException(&(pXVar2->result).super_ExceptionOrValue,exception_00);
  }
  XThreadPaf::FulfillScope::~FulfillScope(&local_20);
  return;
}

Assistant:

void reject(Exception&& exception) const override {
    XThreadPaf::FulfillScope scope(&target);
    if (scope.shouldFulfill()) {
      scope.getTarget<T>()->result.addException(kj::mv(exception));
    }
  }